

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

xmlChar * xmlBufferDetach(xmlBufferPtr buf)

{
  xmlChar *cur;
  
  if (buf == (xmlBufferPtr)0x0) {
    cur = (xmlChar *)0x0;
  }
  else {
    cur = buf->content;
    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (cur != buf->contentIO)) {
      cur = xmlStrndup(cur,buf->use);
      (*xmlFree)(buf->contentIO);
    }
    buf->contentIO = (xmlChar *)0x0;
    buf->content = (xmlChar *)0x0;
    buf->use = 0;
    buf->size = 0;
  }
  return cur;
}

Assistant:

xmlChar *
xmlBufferDetach(xmlBufferPtr buf) {
    xmlChar *ret;

    if (buf == NULL)
        return(NULL);

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
        (buf->content != buf->contentIO)) {
        ret = xmlStrndup(buf->content, buf->use);
        xmlFree(buf->contentIO);
    } else {
        ret = buf->content;
    }

    buf->contentIO = NULL;
    buf->content = NULL;
    buf->size = 0;
    buf->use = 0;

    return ret;
}